

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsSetRuntimeBeforeCollectCallback
          (JsRuntimeHandle runtime,void *callbackState,JsBeforeCollectCallback beforeCollectCallback
          )

{
  anon_class_24_3_8997cdeb fn;
  JsErrorCode JVar1;
  void **in_stack_ffffffffffffffc0;
  JsBeforeCollectCallback local_20;
  JsBeforeCollectCallback beforeCollectCallback_local;
  void *callbackState_local;
  JsRuntimeHandle runtime_local;
  
  fn.beforeCollectCallback = &beforeCollectCallback_local;
  fn.runtime = &local_20;
  fn.callbackState = in_stack_ffffffffffffffc0;
  local_20 = beforeCollectCallback;
  beforeCollectCallback_local = (JsBeforeCollectCallback)callbackState;
  callbackState_local = runtime;
  JVar1 = GlobalAPIWrapper_NoRecord<JsSetRuntimeBeforeCollectCallback::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsSetRuntimeBeforeCollectCallback(_In_ JsRuntimeHandle runtime, _In_opt_ void *callbackState, _In_ JsBeforeCollectCallback beforeCollectCallback)
{
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {
        VALIDATE_INCOMING_RUNTIME_HANDLE(runtime);

        JsrtRuntime::FromHandle(runtime)->SetBeforeCollectCallback(beforeCollectCallback, callbackState);
        return JsNoError;
    });
}